

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQInstance::Mark(SQInstance *this,SQCollectable **chain)

{
  long *plVar1;
  undefined1 *puVar2;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQUnsignedInteger i;
  SQUnsignedInteger nvalues;
  byte *o;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    plVar1 = (long *)in_RDI[1].super_SQRefCounted._uiRef;
    (**(code **)(*plVar1 + 0x20))(plVar1,in_RSI);
    puVar2 = (undefined1 *)
             sqvector<SQClassMember>::size
                       ((sqvector<SQClassMember> *)(in_RDI[1].super_SQRefCounted._uiRef + 0x40));
    for (o = (byte *)0x0; o < puVar2;
        o = (byte *)((long)&(((SQObjectPtr *)o)->super_SQObject)._type + 1)) {
      SQSharedState::MarkObject((SQObjectPtr *)o,(SQCollectable_conflict **)in_RDI);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQInstance::Mark(SQCollectable **chain)
{
    START_MARK()
        _class->Mark(chain);
        SQUnsignedInteger nvalues = _class->_defaultvalues.size();
        for(SQUnsignedInteger i =0; i< nvalues; i++) {
            SQSharedState::MarkObject(_values[i], chain);
        }
    END_MARK()
}